

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCommandBuffersTests.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_0::createPoolResetBitTest
          (TestStatus *__return_storage_ptr__,Context *context)

{
  VkDevice device;
  DeviceInterface *vk;
  VkCommandPoolCreateInfo cmdPoolParams;
  long *local_78;
  long local_70;
  long local_68 [2];
  Move<vk::Handle<(vk::HandleType)24>_> local_58;
  VkCommandPoolCreateInfo local_38;
  
  device = Context::getDevice(context);
  vk = Context::getDeviceInterface(context);
  local_38.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_38.sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
  local_38.pNext = (void *)0x0;
  local_38.flags = 2;
  ::vk::createCommandPool(&local_58,vk,device,&local_38,(VkAllocationCallbacks *)0x0);
  if (local_58.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              (&local_58.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter,
               (VkCommandPool)
               local_58.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal);
  }
  local_58.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_58.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_58.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
  local_58.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"Command Pool allocated correctly.","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_78,local_70 + (long)local_78);
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createPoolResetBitTest(Context& context)
{
	const VkDevice							vkDevice				= context.getDevice();
	const DeviceInterface&					vk						= context.getDeviceInterface();
	const deUint32							queueFamilyIndex		= context.getUniversalQueueFamilyIndex();

	const VkCommandPoolCreateInfo			cmdPoolParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO,					// sType;
		DE_NULL,													// pNext;
		VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT,			// flags;
		queueFamilyIndex,											// queueFamilyIndex;
	};

	createCommandPool(vk, vkDevice, &cmdPoolParams, DE_NULL);

	return tcu::TestStatus::pass("Command Pool allocated correctly.");
}